

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O3

void __thiscall
duckdb::ColumnReader::
PlainSkipTemplatedInternal<duckdb::TemplatedParquetValueConversion<float>,true,true>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t row_offset)

{
  idx_t row_idx;
  uint64_t uVar1;
  
  if (row_offset < row_offset + num_values) {
    uVar1 = 0;
    do {
      if (this->column_schema->max_define == (ulong)defines[uVar1 + row_offset]) {
        ByteBuffer::available(plain_data,4);
        plain_data->len = plain_data->len - 4;
        plain_data->ptr = plain_data->ptr + 4;
      }
      uVar1 = uVar1 + 1;
    } while (num_values != uVar1);
  }
  return;
}

Assistant:

void PlainSkipTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines,
	                                const uint64_t num_values, idx_t row_offset = 0) {
		if (!HAS_DEFINES && CONVERSION::PlainConstantSize() > 0) {
			if (CHECKED) {
				plain_data.inc(num_values * CONVERSION::PlainConstantSize());
			} else {
				plain_data.unsafe_inc(num_values * CONVERSION::PlainConstantSize());
			}
			return;
		}
		for (idx_t row_idx = row_offset; row_idx < row_offset + num_values; row_idx++) {
			if (HAS_DEFINES && defines[row_idx] != MaxDefine()) {
				continue;
			}
			CONVERSION::template PlainSkip<CHECKED>(plain_data, *this);
		}
	}